

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void * SyMemBackendRealloc(SyMemBackend *pBackend,void *pOld,sxu32 nByte)

{
  SyMemBlock *pSVar1;
  long lVar2;
  SyMemBlock **ppSVar3;
  int iVar4;
  SyMemBlock *pSVar5;
  SyMemBlock **ppSVar6;
  SyMemBlock *pSVar7;
  uint uVar8;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  if (pOld == (void *)0x0) {
    pSVar7 = (SyMemBlock *)MemBackendAlloc(pBackend,nByte);
  }
  else {
    pSVar1 = (SyMemBlock *)((long)pOld + -0x10);
    lVar2 = *(long *)((long)pOld + -0x10);
    ppSVar3 = *(SyMemBlock ***)((long)pOld + -8);
    pSVar5 = (SyMemBlock *)(*pBackend->pMethods->xRealloc)(pSVar1,nByte + 0x10);
    if (pSVar5 == (SyMemBlock *)0x0) {
      pSVar7 = (SyMemBlock *)0x0;
      uVar8 = 0;
      do {
        if (((pBackend->xMemError == (ProcMemError)0x0) || (3 < uVar8)) ||
           (iVar4 = (*pBackend->xMemError)(pBackend->pUserData), iVar4 != -0x21)) goto LAB_0010f056;
        uVar8 = uVar8 + 1;
        pSVar5 = (SyMemBlock *)(*pBackend->pMethods->xRealloc)(pSVar1,nByte + 0x10);
      } while (pSVar5 == (SyMemBlock *)0x0);
    }
    if (pSVar5 != pSVar1) {
      ppSVar6 = &pBackend->pBlocks;
      if (ppSVar3 != (SyMemBlock **)0x0) {
        ppSVar6 = ppSVar3;
      }
      *ppSVar6 = pSVar5;
      if (lVar2 != 0) {
        *(SyMemBlock **)(lVar2 + 8) = pSVar5;
      }
    }
    pSVar7 = pSVar5 + 1;
  }
LAB_0010f056:
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
  }
  return pSVar7;
}

Assistant:

JX9_PRIVATE void * SyMemBackendRealloc(SyMemBackend *pBackend, void * pOld, sxu32 nByte)
{
	void *pChunk;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend)  ){
		return 0;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	pChunk = MemBackendRealloc(&(*pBackend), pOld, nByte);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return pChunk;
}